

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLocation.h
# Opt level: O2

void __thiscall flow::FilePos::advance(FilePos *this,char ch)

{
  this->offset = this->offset + 1;
  if (ch == '\n') {
    this->line = this->line + 1;
    this->column = 1;
    return;
  }
  this->column = this->column + 1;
  return;
}

Assistant:

void advance(char ch) {
    offset++;
    if (ch != '\n') {
      column++;
    } else {
      line++;
      column = 1;
    }
  }